

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerResults::GenerateFrameTabularText
          (PS2KeyboardAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  double dVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 in_stack_fffffffffffff5f8;
  undefined4 uVar11;
  char local_968 [8];
  char result_str_2 [255];
  U8 Zmovement;
  U8 FourthButton;
  U8 FifthButton;
  U8 Ymovement;
  U8 Xmovement;
  U8 LeftButton;
  U8 RightButton;
  U8 MiddleButton;
  U8 XSignBit;
  U8 YSignBit;
  U8 XOverflow;
  U8 YOverflow;
  char key_str_1 [512];
  char codetype_1 [32];
  char tmp_str_1 [256];
  char num_str_2 [128];
  char result_str_1 [255];
  char key_str [64];
  char codetype [32];
  char tmp_str [128];
  char num_str_1 [128];
  char result_str [255];
  char cmd_str [64];
  char local_108 [8];
  char num_str [128];
  char device_str [16];
  Frame local_70 [8];
  Frame frame;
  ulonglong local_60;
  ulong local_58;
  byte local_4f;
  DisplayBase display_base_local;
  U64 frame_index_local;
  PS2KeyboardAnalyzerResults *this_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff5f8 >> 0x20);
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_70);
  if ((local_4f & 1) == 0) {
    dVar1 = this->mSettings->mDeviceType;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      sprintf(num_str + 0x78,"Mouse");
      GetKeyName(this,(char *)&Xmovement,local_60,local_4f & 8);
      if ((local_4f & 2) == 0) {
        if ((local_4f & 0x20) == 0) {
          AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
          sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
          sprintf(key_str_1 + 0x1f8,"DATA");
          sprintf((char *)&Xmovement,"");
        }
        else {
          AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,0x20,tmp_str_1 + 0xf8,0x80);
          sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
          sprintf(key_str_1 + 0x1f8,"MOVEMENT");
          uVar7 = (local_60 & 0x80) >> 7;
          uVar8 = (local_60 & 0x40) >> 6;
          uVar9 = (local_60 & 0x20) >> 5;
          uVar10 = (local_60 & 0x10) >> 4;
          bVar4 = (byte)((local_60 & 4) >> 2);
          bVar5 = (byte)((local_60 & 2) >> 1);
          bVar6 = (byte)local_60 & 1;
          bVar2 = (byte)(local_60 >> 8);
          bVar3 = (byte)(local_60 >> 0x10);
          dVar1 = this->mSettings->mDeviceType;
          if ((dVar1 != 1.0) || (NAN(dVar1))) {
            result_str_2[0xfe] = (char)((local_60 & 0x20000000) >> 0x1d);
            result_str_2[0xfd] = '\0';
            result_str_2[0xfc] = (byte)(local_60 >> 0x18) & 0xf;
            sprintf((char *)&Xmovement,
                    "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
                    ,uVar7,uVar8,uVar9,uVar10,CONCAT44(uVar11,(uint)bVar4),(uint)bVar5,(uint)bVar6,0
                    ,(uint)(byte)result_str_2[0xfe],(uint)bVar2,(uint)bVar3,
                    (uint)(byte)result_str_2[0xfc]);
          }
          else {
            sprintf((char *)&Xmovement,
                    "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
                    ,uVar7,uVar8,uVar9,uVar10,CONCAT44(uVar11,(uint)bVar4),(uint)bVar5,(uint)bVar6,
                    (uint)bVar2,(uint)bVar3);
          }
        }
      }
      else if ((local_58 & 1) == 0) {
        if ((local_58 & 4) != 0) {
          AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
          sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
          sprintf(key_str_1 + 0x1f8,"BAT");
          sprintf((char *)&Xmovement,"Power-On Self Test Successfull");
        }
      }
      else {
        AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
        sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
        sprintf(key_str_1 + 0x1f8,"ACK");
        sprintf((char *)&Xmovement,"");
      }
      sprintf(tmp_str_1 + 0xf8,"%s",codetype_1 + 0x18);
      sprintf(local_968,"%s: %s %s (%s)",num_str + 0x78,key_str_1 + 0x1f8,&Xmovement,
              tmp_str_1 + 0xf8);
      AnalyzerResults::AddTabularText
                ((char *)this,local_968,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      sprintf(num_str + 0x78,"Keyboard");
      AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,8,tmp_str + 0x78,0x20);
      GetKeyName(this,result_str_1 + 0xf8,local_60,local_4f & 8);
      if ((local_4f & 2) == 0) {
        if ((local_4f & 0x80) == 0) {
          if ((local_4f & 0x40) == 0) {
            if (((local_4f & 0x20) == 0) || ((local_4f & 0x10) == 0)) {
              if ((local_4f & 0x20) == 0) {
                if (((local_4f & 8) == 0) || ((local_4f & 0x10) == 0)) {
                  if ((local_4f & 8) == 0) {
                    if ((local_4f & 0x10) == 0) {
                      sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
                      sprintf(key_str + 0x38,"MAKE");
                    }
                    else {
                      sprintf(codetype + 0x18,"0xF0, %s",tmp_str + 0x78);
                      sprintf(key_str + 0x38,"BREAK");
                    }
                  }
                  else {
                    sprintf(codetype + 0x18,"0xE0, %s",tmp_str + 0x78);
                    sprintf(key_str + 0x38,"MAKE");
                  }
                }
                else {
                  sprintf(codetype + 0x18,"0xE0, 0xF0, %s",tmp_str + 0x78);
                  sprintf(key_str + 0x38,"BREAK");
                }
              }
              else {
                sprintf(codetype + 0x18,"0xE0, 0x12, 0xE0, 0x7C");
                sprintf(key_str + 0x38,"MAKE");
                sprintf(result_str_1 + 0xf8,"[PRINT SCREEN]");
              }
            }
            else {
              sprintf(codetype + 0x18,"0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12");
              sprintf(key_str + 0x38,"BREAK");
              sprintf(result_str_1 + 0xf8,"[PRINT SCREEN]");
            }
          }
          else {
            sprintf(codetype + 0x18,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77");
            sprintf(key_str + 0x38,"");
            sprintf(result_str_1 + 0xf8,"[PAUSE/BREAK]");
          }
        }
        else {
          sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
          sprintf(key_str + 0x38,"ERROR");
          sprintf(result_str_1 + 0xf8,"INVALID CODE");
        }
      }
      else if ((local_58 & 1) == 0) {
        if ((local_58 & 2) == 0) {
          if ((local_58 & 4) != 0) {
            sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
            sprintf(key_str + 0x38,"BAT");
            sprintf(result_str_1 + 0xf8,"Power-On Self Test Successfull");
          }
        }
        else {
          sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
          sprintf(key_str + 0x38,"ECHO");
          sprintf(result_str_1 + 0xf8,"");
        }
      }
      else {
        sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
        sprintf(key_str + 0x38,"ACK");
        sprintf(result_str_1 + 0xf8,"");
      }
      sprintf(tmp_str + 0x78,"%s",codetype + 0x18);
      sprintf(num_str_2 + 0x78,"%s: %s %s (%s)",num_str + 0x78,key_str + 0x38,result_str_1 + 0xf8,
              tmp_str + 0x78);
      AnalyzerResults::AddTabularText
                ((char *)this,num_str_2 + 0x78,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    sprintf(num_str + 0x78,"Host");
    AnalyzerHelpers::GetNumberString(local_60,Hexadecimal,8,local_108,0x20);
    GetCommandName(this,result_str + 0xf8,local_60,this->mSettings->mDeviceType);
    sprintf(num_str_1 + 0x78,"%s: %s (%s)",num_str + 0x78,result_str + 0xf8,local_108);
    AnalyzerResults::AddTabularText
              ((char *)this,num_str_1 + 0x78,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_70);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();
    Frame frame = GetFrame( frame_index );

    char device_str[ 16 ];
    if( frame.mFlags & TX_HOST_TO_DEVICE )
    {
        sprintf( device_str, "Host" );

        char num_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

        char cmd_str[ 64 ];
        GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

        char result_str[ 255 ];

        sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );
        AddTabularText( result_str );
    }
    else
    {
        if( mSettings->mDeviceType == 0 )
        {
            sprintf( device_str, "Keyboard" );

            char num_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

            char tmp_str[ 128 ];
            char codetype[ 32 ];

            char key_str[ 64 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & ECHO_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ECHO" );

                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & ERROR_FRAME )
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "ERROR" );
                sprintf( key_str, "INVALID CODE" );
            }
            else if( frame.mFlags & PAUSE_BREAK )
            {
                sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                sprintf( codetype, "" );
                sprintf( key_str, "[PAUSE/BREAK]" );
            }
            else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                sprintf( codetype, "BREAK" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & PRINT_SCREEN )
            {
                sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                sprintf( codetype, "MAKE" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else if( frame.mFlags & EXTENDED_KEY )
            {
                sprintf( tmp_str, "0xE0, %s", num_str );
                sprintf( codetype, "MAKE" );
            }
            else if( frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MAKE" );
            }

            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];

            // at next zoom show originator and raw hex
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
        else
        {
            sprintf( device_str, "Mouse" );

            char num_str[ 128 ];

            char tmp_str[ 256 ];
            char codetype[ 32 ];

            char key_str[ 512 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & MOVEMENT_FRAME )
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MOVEMENT" );

                U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                U8 LeftButton = frame.mData1 & 0x01;

                U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                if( mSettings->mDeviceType == 1 )
                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "deltaX: %d, deltaY: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement, Ymovement );
                else
                {
                    U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                    U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                    U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton, FifthButton,
                             Xmovement, Ymovement, Zmovement );
                }
            }
            else
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "DATA" );

                sprintf( key_str, "" );
            }
            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
    }
}